

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O0

void Assimp::FBX::anon_unknown_3::TokenizeError(string *message,uint line,uint column)

{
  DeadlyImportError *this;
  allocator<char> local_59;
  string local_58;
  string local_38;
  uint local_18;
  uint local_14;
  uint column_local;
  uint line_local;
  string *message_local;
  
  local_18 = column;
  local_14 = line;
  _column_local = message;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FBX-Tokenize",&local_59);
  Util::AddLineAndColumn(&local_38,&local_58,_column_local,local_14,local_18);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

AI_WONT_RETURN void TokenizeError(const std::string& message, unsigned int line, unsigned int column)
{
    throw DeadlyImportError(Util::AddLineAndColumn("FBX-Tokenize",message,line,column));
}